

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_then_execute.cpp
# Opt level: O1

void test_then_execute<has_then_execute_member>(has_then_execute_member *exec)

{
  int iVar1;
  has_then_execute_member *__stat_loc;
  executor_future_t<has_then_execute_member,_typename_std::result_of<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_then_execute_cpp:88:75)_(future_result_t<future<int>_>_&)>::type>
  result_future;
  int result;
  future<int> predecessor_future;
  future<int> local_48;
  int local_34;
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  element_type *local_20;
  
  std::
  async<test_then_execute<has_then_execute_member>(has_then_execute_member_const&)::_lambda()_1_>
            ((launch)local_30,(anon_class_1_0_00000001_for__M_head_impl *)0x3);
  has_then_execute_member::
  then_execute<test_then_execute<has_then_execute_member>(has_then_execute_member_const&)::_lambda(int&)_1_,int>
            ((has_then_execute_member *)&local_48,(anon_class_1_0_00000001_for_func *)exec,
             (future<int> *)&local_20);
  iVar1 = std::future<int>::get(&local_48);
  if (iVar1 != 2) {
    __assert_fail("2 == result_future.get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_then_execute.cpp"
                  ,0x5f,
                  "void test_then_execute(const Executor &) [Executor = has_then_execute_member]");
  }
  if (local_48.super___basic_future<int>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___basic_future<int>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  std::
  async<test_then_execute<has_then_execute_member>(has_then_execute_member_const&)::_lambda()_2_>
            ((launch)local_30,(anon_class_1_0_00000001_for__M_head_impl *)0x3);
  has_then_execute_member::
  then_execute<test_then_execute<has_then_execute_member>(has_then_execute_member_const&)::_lambda()_3_>
            ((has_then_execute_member *)&local_48,(anon_class_1_0_00000001_for_func *)exec,
             (future<void> *)&local_20);
  iVar1 = std::future<int>::get(&local_48);
  if (iVar1 == 1) {
    if (local_48.super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___basic_future<int>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    std::
    async<test_then_execute<has_then_execute_member>(has_then_execute_member_const&)::_lambda()_4_>
              ((launch)local_30,(anon_class_1_0_00000001_for__M_head_impl *)0x3);
    local_34 = 0;
    __stat_loc = exec;
    local_20 = (element_type *)&local_34;
    has_then_execute_member::
    then_execute<test_then_execute<has_then_execute_member>(has_then_execute_member_const&)::_lambda(int&)_2_,int>
              ((has_then_execute_member *)&local_48,(anon_class_8_1_6971b95b_for_func *)exec,
               (future<int> *)&local_20);
    if (local_48.super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (_State_baseV2 *)0x0) {
      std::__throw_future_error(3);
    }
    else {
      std::__future_base::_State_baseV2::wait
                (local_48.super___basic_future<int>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,__stat_loc);
      if (local_34 == 1) {
        if (local_48.super___basic_future<int>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___basic_future<int>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
        }
        std::
        async<test_then_execute<has_then_execute_member>(has_then_execute_member_const&)::_lambda()_5_>
                  ((launch)local_30,(anon_class_1_0_00000001_for__M_head_impl *)0x3);
        local_34 = 0;
        local_20 = (element_type *)&local_34;
        has_then_execute_member::
        then_execute<test_then_execute<has_then_execute_member>(has_then_execute_member_const&)::_lambda()_6_>
                  ((has_then_execute_member *)&local_48,(anon_class_8_1_f8e7f5fd_for_func *)exec,
                   (future<void> *)&local_20);
        if (local_48.super___basic_future<int>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            == (_State_baseV2 *)0x0) {
          std::__throw_future_error(3);
        }
        else {
          std::__future_base::_State_baseV2::wait
                    (local_48.super___basic_future<int>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,exec);
          if (local_34 == 0xd) {
            if (local_48.super___basic_future<int>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_48.super___basic_future<int>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
            }
            return;
          }
        }
        __assert_fail("13 == expect_thirteen",
                      "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_then_execute.cpp"
                      ,0x91,
                      "void test_then_execute(const Executor &) [Executor = has_then_execute_member]"
                     );
      }
    }
    __assert_fail("1 == result",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_then_execute.cpp"
                  ,0x7f,
                  "void test_then_execute(const Executor &) [Executor = has_then_execute_member]");
  }
  __assert_fail("1 == result_future.get()",
                "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_then_execute.cpp"
                ,0x6d,
                "void test_then_execute(const Executor &) [Executor = has_then_execute_member]");
}

Assistant:

void test_then_execute(const Executor& exec)
{
  {
    // non-void predecessor to non-void result

    std::future<int> predecessor_future = std::async([] { return 1; });

    auto result_future = std::experimental::execution::then_execute(exec, [](int& predecessor)
    {
      return 1 + predecessor;
    },
    predecessor_future
    );

    assert(2 == result_future.get());
  }

  {
    // void predecessor to non-void result
    std::future<void> predecessor_future = std::async([]{});

    auto result_future = std::experimental::execution::then_execute(exec, []
    {
      return 1;
    },
    predecessor_future
    );

    assert(1 == result_future.get());
  }

  {
    // non-void predecessor_future to void result

    std::future<int> predecessor_future = std::async([] { return 1; });

    int result = 0;
    auto result_future = std::experimental::execution::then_execute(exec, [&](int& predecessor)
    {
      result = predecessor;
    },
    predecessor_future
    );

    result_future.wait();

    assert(1 == result);
  }

  {
    // void predecessor_future to void result

    std::future<void> predecessor_future = std::async([]{});

    int expect_thirteen = 0;
    auto result_future = std::experimental::execution::then_execute(exec, [&]
    {
      expect_thirteen = 13;
    },
    predecessor_future
    );

    result_future.wait();

    assert(13 == expect_thirteen);
  }
}